

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall
ncnn::Net::forward_layer
          (Net *this,int layer_index,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats,
          Option *opt)

{
  Mat *pMVar1;
  undefined8 *puVar2;
  int *piVar3;
  pointer pMVar4;
  long *plVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  void *pvVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  pointer pMVar19;
  int *piVar20;
  pointer piVar21;
  pointer piVar22;
  Layer *pLVar23;
  ulong uVar24;
  Option *__arg;
  ulong uVar25;
  long lVar26;
  bool bVar27;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  Mat m;
  Mat local_d8;
  Mat local_98;
  allocator_type local_49;
  Layer *local_48;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_40;
  Net *local_38;
  
  pLVar23 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
            .super__Vector_impl_data._M_start[layer_index];
  local_48 = pLVar23;
  local_38 = this;
  if (pLVar23->one_blob_only == true) {
    iVar18 = *(pLVar23->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar16 = *(pLVar23->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar19 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (pMVar19[iVar18].dims == 0) {
      iVar17 = forward_layer(this,(this->blobs).
                                  super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                  _M_impl.super__Vector_impl_data._M_start[iVar18].producer,
                             blob_mats,opt);
      if (iVar17 != 0) {
        return iVar17;
      }
      pMVar19 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
    }
    pLVar23 = local_48;
    local_d8.data = pMVar19[iVar18].data;
    piVar20 = pMVar19[iVar18].refcount;
    local_d8.refcount._0_4_ = SUB84(piVar20,0);
    local_d8.refcount._4_4_ = (undefined4)((ulong)piVar20 >> 0x20);
    local_d8.elemsize._0_4_ = (undefined4)pMVar19[iVar18].elemsize;
    local_d8.elemsize._4_4_ = (undefined4)(pMVar19[iVar18].elemsize >> 0x20);
    local_d8.elempack = pMVar19[iVar18].elempack;
    local_d8.allocator = pMVar19[iVar18].allocator;
    pMVar4 = pMVar19 + iVar18;
    local_d8.dims = pMVar4->dims;
    local_d8.w = pMVar4->w;
    local_d8._48_8_ = *(undefined8 *)(&pMVar4->dims + 2);
    local_d8.cstep = pMVar19[iVar18].cstep;
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + 1;
      UNLOCK();
    }
    if (opt->lightmode == true) {
      pMVar4 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pMVar19 = pMVar4 + iVar18;
      piVar20 = pMVar4[iVar18].refcount;
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 == 0) {
          if (pMVar19->allocator == (Allocator *)0x0) {
            if (pMVar19->data != (void *)0x0) {
              free(pMVar19->data);
            }
          }
          else {
            (**(code **)(*(long *)pMVar19->allocator + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&pMVar19->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar19->elemsize + 4) = 0;
      pMVar19->data = (void *)0x0;
      pMVar19->refcount = (int *)0x0;
      pMVar19->dims = 0;
      pMVar19->w = 0;
      pMVar19->h = 0;
      pMVar19->c = 0;
      pMVar19->cstep = 0;
      if ((pLVar23->support_inplace == true) &&
         (*(int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_) != 1)) {
        if ((local_d8.data == (void *)0x0) || (local_d8.cstep * (long)local_d8.c == 0)) {
          local_98.elemsize._0_4_ = 0;
          local_98.elemsize._4_4_ = 0;
          local_98.elempack = 0;
          local_98.data = (void *)0x0;
          local_98.refcount._0_4_ = 0;
          local_98.refcount._4_4_ = 0;
          local_98.allocator = (Allocator *)0x0;
          local_98.dims = 0;
          local_98.w = 0;
          local_98.h = 0;
          local_98.c = 0;
          local_98.cstep = 0;
        }
        else {
          local_98.elemsize._0_4_ = 0;
          local_98.elemsize._4_4_ = 0;
          local_98.elempack = 0;
          local_98.data = (void *)0x0;
          local_98.refcount._0_4_ = 0;
          local_98.refcount._4_4_ = 0;
          local_98.allocator = (Allocator *)0x0;
          local_98.dims = 0;
          local_98.w = 0;
          local_98.h = 0;
          local_98.c = 0;
          local_98.cstep = 0;
          if (local_d8.dims == 3) {
            Mat::create(&local_98,local_d8.w,local_d8.h,local_d8.c,
                        CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize),
                        local_d8.elempack,(Allocator *)0x0);
          }
          else if (local_d8.dims == 2) {
            Mat::create(&local_98,local_d8.w,local_d8.h,
                        CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize),
                        local_d8.elempack,(Allocator *)0x0);
          }
          else if (local_d8.dims == 1) {
            Mat::create(&local_98,local_d8.w,
                        CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize),
                        local_d8.elempack,(Allocator *)0x0);
          }
          if ((long)local_d8.c * local_d8.cstep != 0) {
            memcpy(local_98.data,local_d8.data,
                   (long)local_d8.c * local_d8.cstep *
                   CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize));
          }
        }
        piVar20 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + 1;
          UNLOCK();
        }
        piVar20 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (local_d8.allocator == (Allocator *)0x0) {
              if (local_d8.data != (void *)0x0) {
                free(local_d8.data);
              }
            }
            else {
              (**(code **)(*(long *)local_d8.allocator + 0x18))();
            }
          }
        }
        piVar20 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        local_d8.data = local_98.data;
        local_d8.refcount._0_4_ = local_98.refcount._0_4_;
        local_d8.refcount._4_4_ = local_98.refcount._4_4_;
        local_d8.elemsize._0_4_ = (undefined4)local_98.elemsize;
        local_d8.elemsize._4_4_ = local_98.elemsize._4_4_;
        local_d8.elempack = local_98.elempack;
        local_d8.allocator = local_98.allocator;
        uVar7._0_4_ = local_98.dims;
        uVar7._4_4_ = local_98.w;
        local_d8.dims = local_98.dims;
        local_d8.w = local_98.w;
        uVar8._0_4_ = local_98.h;
        uVar8._4_4_ = local_98.c;
        local_d8.h = local_98.h;
        local_d8.c = local_98.c;
        local_d8.cstep = local_98.cstep;
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
              if (local_98.data != (void *)0x0) {
                local_d8._40_8_ = uVar7;
                local_d8._48_8_ = uVar8;
                free(local_98.data);
              }
            }
            else {
              local_d8._40_8_ = uVar7;
              local_d8._48_8_ = uVar8;
              (**(code **)(*(long *)local_98.allocator + 0x18))();
            }
          }
        }
      }
    }
    uVar7 = local_d8._40_8_;
    uVar8 = local_d8._48_8_;
    if (opt->use_bf16_storage == true) {
      uVar25 = CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
      uVar24 = (ulong)local_d8.elempack;
      if ((uVar25 / uVar24 == 4) && (pLVar23->support_bf16_storage == true)) {
        local_98.elemsize._0_4_ = 0;
        local_98.elemsize._4_4_ = 0;
        local_98.elempack = 0;
        local_98.data = (void *)0x0;
        local_98.refcount._0_4_ = 0;
        local_98.refcount._4_4_ = 0;
        local_98.allocator = (Allocator *)0x0;
        local_98.dims = 0;
        local_98.w = 0;
        local_98.h = 0;
        local_98.c = 0;
        local_98.cstep = 0;
        cast_float32_to_bfloat16(&local_d8,&local_98,opt);
        piVar20 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + 1;
          UNLOCK();
        }
        piVar20 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (local_d8.allocator == (Allocator *)0x0) {
              if (local_d8.data != (void *)0x0) {
                free(local_d8.data);
              }
            }
            else {
              (**(code **)(*(long *)local_d8.allocator + 0x18))();
            }
          }
        }
        piVar20 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        local_d8.data = local_98.data;
        local_d8.refcount._0_4_ = local_98.refcount._0_4_;
        local_d8.refcount._4_4_ = local_98.refcount._4_4_;
        local_d8.elemsize._0_4_ = (undefined4)local_98.elemsize;
        local_d8.elemsize._4_4_ = local_98.elemsize._4_4_;
        local_d8.elempack = local_98.elempack;
        local_d8.allocator = local_98.allocator;
        uVar9._0_4_ = local_98.dims;
        uVar9._4_4_ = local_98.w;
        local_d8.dims = local_98.dims;
        local_d8.w = local_98.w;
        uVar10._0_4_ = local_98.h;
        uVar10._4_4_ = local_98.c;
        local_d8.h = local_98.h;
        local_d8.c = local_98.c;
        local_d8.cstep = local_98.cstep;
        uVar7 = uVar9;
        uVar8 = uVar10;
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          uVar7 = local_d8._40_8_;
          uVar8 = local_d8._48_8_;
          if (*piVar20 == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
              if (local_98.data != (void *)0x0) {
                local_d8._40_8_ = uVar9;
                local_d8._48_8_ = uVar10;
                free(local_98.data);
                uVar7 = local_d8._40_8_;
                uVar8 = local_d8._48_8_;
              }
            }
            else {
              local_d8._40_8_ = uVar9;
              local_d8._48_8_ = uVar10;
              (**(code **)(*(long *)local_98.allocator + 0x18))();
              uVar7 = local_d8._40_8_;
              uVar8 = local_d8._48_8_;
            }
          }
        }
        local_d8._48_8_ = uVar8;
        local_d8._40_8_ = uVar7;
        uVar25 = CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
        uVar24 = (ulong)local_d8.elempack;
      }
      uVar7 = local_d8._40_8_;
      uVar8 = local_d8._48_8_;
      if ((uVar25 / uVar24 == 2) && (pLVar23->support_bf16_storage == false)) {
        local_98.elemsize._0_4_ = 0;
        local_98.elemsize._4_4_ = 0;
        local_98.elempack = 0;
        local_98.data = (void *)0x0;
        local_98.refcount._0_4_ = 0;
        local_98.refcount._4_4_ = 0;
        local_98.allocator = (Allocator *)0x0;
        local_98.dims = 0;
        local_98.w = 0;
        local_98.h = 0;
        local_98.c = 0;
        local_98.cstep = 0;
        cast_bfloat16_to_float32(&local_d8,&local_98,opt);
        piVar20 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + 1;
          UNLOCK();
        }
        piVar20 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (local_d8.allocator == (Allocator *)0x0) {
              if (local_d8.data != (void *)0x0) {
                free(local_d8.data);
              }
            }
            else {
              (**(code **)(*(long *)local_d8.allocator + 0x18))();
            }
          }
        }
        piVar20 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        local_d8.data = local_98.data;
        local_d8.refcount._0_4_ = local_98.refcount._0_4_;
        local_d8.refcount._4_4_ = local_98.refcount._4_4_;
        local_d8.elemsize._0_4_ = (undefined4)local_98.elemsize;
        local_d8.elemsize._4_4_ = local_98.elemsize._4_4_;
        local_d8.elempack = local_98.elempack;
        local_d8.allocator = local_98.allocator;
        uVar11._0_4_ = local_98.dims;
        uVar11._4_4_ = local_98.w;
        local_d8.dims = local_98.dims;
        local_d8.w = local_98.w;
        uVar12._0_4_ = local_98.h;
        uVar12._4_4_ = local_98.c;
        local_d8.h = local_98.h;
        local_d8.c = local_98.c;
        local_d8.cstep = local_98.cstep;
        uVar7 = uVar11;
        uVar8 = uVar12;
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          uVar7 = local_d8._40_8_;
          uVar8 = local_d8._48_8_;
          if (*piVar20 == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
              if (local_98.data != (void *)0x0) {
                local_d8._40_8_ = uVar11;
                local_d8._48_8_ = uVar12;
                free(local_98.data);
                uVar7 = local_d8._40_8_;
                uVar8 = local_d8._48_8_;
              }
            }
            else {
              local_d8._40_8_ = uVar11;
              local_d8._48_8_ = uVar12;
              (**(code **)(*(long *)local_98.allocator + 0x18))();
              uVar7 = local_d8._40_8_;
              uVar8 = local_d8._48_8_;
            }
          }
        }
      }
    }
    local_d8._48_8_ = uVar8;
    local_d8._40_8_ = uVar7;
    uVar7 = local_d8._40_8_;
    uVar8 = local_d8._48_8_;
    if (opt->use_packing_layout == true) {
      local_98.elemsize._0_4_ = 0;
      local_98.elemsize._4_4_ = 0;
      local_98.elempack = 0;
      local_98.data = (void *)0x0;
      local_98.refcount._0_4_ = 0;
      local_98.refcount._4_4_ = 0;
      local_98.allocator = (Allocator *)0x0;
      local_98.dims = 0;
      local_98.w = 0;
      local_98.h = 0;
      local_98.c = 0;
      local_98.cstep = 0;
      convert_packing(&local_d8,&local_98,
                      (uint)pLVar23->support_packing + (uint)pLVar23->support_packing * 2 + 1,opt);
      piVar20 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + 1;
        UNLOCK();
      }
      piVar20 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 == 0) {
          if (local_d8.allocator == (Allocator *)0x0) {
            if (local_d8.data != (void *)0x0) {
              free(local_d8.data);
            }
          }
          else {
            (**(code **)(*(long *)local_d8.allocator + 0x18))();
          }
        }
      }
      piVar20 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      local_d8.data = local_98.data;
      local_d8.refcount._0_4_ = local_98.refcount._0_4_;
      local_d8.refcount._4_4_ = local_98.refcount._4_4_;
      local_d8.elemsize._0_4_ = (undefined4)local_98.elemsize;
      local_d8.elemsize._4_4_ = local_98.elemsize._4_4_;
      local_d8.elempack = local_98.elempack;
      local_d8.allocator = local_98.allocator;
      uVar13._0_4_ = local_98.dims;
      uVar13._4_4_ = local_98.w;
      local_d8.dims = local_98.dims;
      local_d8.w = local_98.w;
      uVar14._0_4_ = local_98.h;
      uVar14._4_4_ = local_98.c;
      local_d8.h = local_98.h;
      local_d8.c = local_98.c;
      local_d8.cstep = local_98.cstep;
      uVar7 = uVar13;
      uVar8 = uVar14;
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        uVar7 = local_d8._40_8_;
        uVar8 = local_d8._48_8_;
        if (*piVar20 == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if (local_98.data != (void *)0x0) {
              local_d8._40_8_ = uVar13;
              local_d8._48_8_ = uVar14;
              free(local_98.data);
              uVar7 = local_d8._40_8_;
              uVar8 = local_d8._48_8_;
            }
          }
          else {
            local_d8._40_8_ = uVar13;
            local_d8._48_8_ = uVar14;
            (**(code **)(*(long *)local_98.allocator + 0x18))();
            uVar7 = local_d8._40_8_;
            uVar8 = local_d8._48_8_;
          }
        }
      }
    }
    local_d8._48_8_ = uVar8;
    local_d8._40_8_ = uVar7;
    if ((opt->lightmode == true) && (pLVar23->support_inplace == true)) {
      iVar17 = (*pLVar23->_vptr_Layer[9])(pLVar23,&local_d8,opt);
      iVar18 = 0;
      if (iVar17 == 0) {
        pMVar19 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start + iVar16;
        bVar27 = true;
        if (pMVar19 != &local_d8) {
          piVar20 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
          if (piVar20 != (int *)0x0) {
            LOCK();
            *piVar20 = *piVar20 + 1;
            UNLOCK();
          }
          piVar20 = pMVar19->refcount;
          if (piVar20 != (int *)0x0) {
            LOCK();
            *piVar20 = *piVar20 + -1;
            UNLOCK();
            if (*piVar20 == 0) {
              if (pMVar19->allocator == (Allocator *)0x0) {
                if (pMVar19->data != (void *)0x0) {
                  free(pMVar19->data);
                }
              }
              else {
                (**(code **)(*(long *)pMVar19->allocator + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&pMVar19->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar19->elemsize + 4) = 0;
          pMVar19->data = (void *)0x0;
          pMVar19->refcount = (int *)0x0;
          pMVar19->dims = 0;
          pMVar19->w = 0;
          pMVar19->h = 0;
          pMVar19->c = 0;
          pMVar19->cstep = 0;
          pMVar19->data = local_d8.data;
          pMVar19->refcount = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
          pMVar19->elemsize = CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
          pMVar19->elempack = local_d8.elempack;
          pMVar19->allocator = local_d8.allocator;
          pMVar19->dims = local_d8.dims;
          pMVar19->w = local_d8.w;
          pMVar19->h = local_d8.h;
          pMVar19->c = local_d8.c;
          pMVar19->cstep = local_d8.cstep;
        }
      }
      else {
        bVar27 = false;
        iVar18 = iVar17;
      }
    }
    else {
      local_98.elemsize._0_4_ = 0;
      local_98.elemsize._4_4_ = 0;
      local_98.elempack = 0;
      local_98.data = (void *)0x0;
      local_98.refcount._0_4_ = 0;
      local_98.refcount._4_4_ = 0;
      local_98.allocator = (Allocator *)0x0;
      local_98.dims = 0;
      local_98.w = 0;
      local_98.h = 0;
      local_98.c = 0;
      local_98.cstep = 0;
      iVar18 = (*pLVar23->_vptr_Layer[7])(pLVar23,&local_d8,&local_98,opt);
      bVar27 = iVar18 == 0;
      if ((bVar27) &&
         (pMVar19 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start + iVar16, pMVar19 != &local_98)) {
        piVar20 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + 1;
          UNLOCK();
        }
        piVar20 = pMVar19->refcount;
        if (piVar20 != (int *)0x0) {
          LOCK();
          *piVar20 = *piVar20 + -1;
          UNLOCK();
          if (*piVar20 == 0) {
            if (pMVar19->allocator == (Allocator *)0x0) {
              if (pMVar19->data != (void *)0x0) {
                free(pMVar19->data);
              }
            }
            else {
              (**(code **)(*(long *)pMVar19->allocator + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&pMVar19->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar19->elemsize + 4) = 0;
        pMVar19->data = (void *)0x0;
        pMVar19->refcount = (int *)0x0;
        pMVar19->dims = 0;
        pMVar19->w = 0;
        pMVar19->h = 0;
        pMVar19->c = 0;
        pMVar19->cstep = 0;
        pMVar19->data = local_98.data;
        pMVar19->refcount = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        pMVar19->elemsize = CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
        pMVar19->elempack = local_98.elempack;
        pMVar19->allocator = local_98.allocator;
        pMVar19->dims = local_98.dims;
        pMVar19->w = local_98.w;
        pMVar19->h = local_98.h;
        pMVar19->c = local_98.c;
        pMVar19->cstep = local_98.cstep;
      }
      piVar20 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 == 0) {
          if (local_98.allocator == (Allocator *)0x0) {
            if (local_98.data != (void *)0x0) {
              free(local_98.data);
            }
          }
          else {
            (**(code **)(*(long *)local_98.allocator + 0x18))();
          }
        }
      }
    }
    piVar20 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + -1;
      UNLOCK();
      if (*piVar20 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_d8.allocator + 0x18))();
        }
      }
    }
    if (!bVar27) {
      return iVar18;
    }
  }
  else {
    __arg = opt;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_98,
               (long)(pLVar23->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               *(long *)&(pLVar23->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data >> 2,(allocator_type *)&local_d8);
    piVar21 = (pLVar23->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_40 = blob_mats;
    if ((pLVar23->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar21) {
      lVar26 = 0;
      uVar25 = 0;
      do {
        iVar18 = piVar21[uVar25];
        pMVar19 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (pMVar19[iVar18].dims == 0) {
          iVar16 = forward_layer(local_38,(local_38->blobs).
                                          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>
                                          ._M_impl.super__Vector_impl_data._M_start[iVar18].producer
                                 ,blob_mats,opt);
          if (iVar16 != 0) goto LAB_0012e528;
          pMVar19 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
        }
        pvVar15 = local_98.data;
        pMVar19 = pMVar19 + iVar18;
        pMVar4 = (pointer)((long)local_98.data + lVar26);
        if (pMVar4 != pMVar19) {
          piVar20 = pMVar19->refcount;
          if (piVar20 != (int *)0x0) {
            LOCK();
            *piVar20 = *piVar20 + 1;
            UNLOCK();
          }
          piVar20 = *(int **)((long)local_98.data + lVar26 + 8);
          if (piVar20 != (int *)0x0) {
            LOCK();
            *piVar20 = *piVar20 + -1;
            UNLOCK();
            if (*piVar20 == 0) {
              plVar5 = *(long **)((long)local_98.data + lVar26 + 0x20);
              if (plVar5 == (long *)0x0) {
                if (*(void **)((long)local_98.data + lVar26) != (void *)0x0) {
                  free(*(void **)((long)local_98.data + lVar26));
                }
              }
              else {
                (**(code **)(*plVar5 + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&pMVar4->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar4->elemsize + 4) = 0;
          pMVar4->data = (void *)0x0;
          pMVar4->refcount = (int *)0x0;
          puVar2 = (undefined8 *)((long)pvVar15 + lVar26 + 0x28);
          *puVar2 = 0;
          puVar2[1] = 0;
          *(undefined8 *)((long)pvVar15 + lVar26 + 0x38) = 0;
          piVar20 = pMVar19->refcount;
          *(undefined8 *)((long)pvVar15 + lVar26) = pMVar19->data;
          ((undefined8 *)((long)pvVar15 + lVar26))[1] = piVar20;
          *(size_t *)((long)pvVar15 + lVar26 + 0x10) = pMVar19->elemsize;
          *(int *)((long)pvVar15 + lVar26 + 0x18) = pMVar19->elempack;
          *(Allocator **)((long)pvVar15 + lVar26 + 0x20) = pMVar19->allocator;
          iVar16 = pMVar19->w;
          iVar17 = pMVar19->h;
          iVar6 = pMVar19->c;
          piVar20 = (int *)((long)pvVar15 + lVar26 + 0x28);
          *piVar20 = pMVar19->dims;
          piVar20[1] = iVar16;
          piVar20[2] = iVar17;
          piVar20[3] = iVar6;
          *(size_t *)((long)pvVar15 + lVar26 + 0x38) = pMVar19->cstep;
        }
        pLVar23 = local_48;
        blob_mats = local_40;
        if (opt->lightmode == true) {
          pMVar4 = (local_40->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pMVar19 = pMVar4 + iVar18;
          piVar20 = pMVar4[iVar18].refcount;
          if (piVar20 != (int *)0x0) {
            LOCK();
            *piVar20 = *piVar20 + -1;
            UNLOCK();
            if (*piVar20 == 0) {
              if (pMVar19->allocator == (Allocator *)0x0) {
                if (pMVar19->data != (void *)0x0) {
                  free(pMVar19->data);
                }
              }
              else {
                (**(code **)(*(long *)pMVar19->allocator + 0x18))();
              }
            }
          }
          blob_mats = local_40;
          pLVar23 = local_48;
          *(undefined8 *)((long)&pMVar19->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar19->elemsize + 4) = 0;
          pMVar19->data = (void *)0x0;
          pMVar19->refcount = (int *)0x0;
          pMVar19->dims = 0;
          pMVar19->w = 0;
          pMVar19->h = 0;
          pMVar19->c = 0;
          pMVar19->cstep = 0;
          if ((local_48->support_inplace == true) &&
             (**(int **)((long)local_98.data + lVar26 + 8) != 1)) {
            Mat::clone(&local_d8,(__fn *)((long)local_98.data + lVar26),(void *)0x0,(int)opt,__arg);
            pvVar15 = local_98.data;
            pMVar1 = (Mat *)((long)local_98.data + lVar26);
            piVar20 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
            if (pMVar1 != &local_d8) {
              if (piVar20 != (int *)0x0) {
                LOCK();
                *piVar20 = *piVar20 + 1;
                UNLOCK();
              }
              piVar20 = *(int **)((long)local_98.data + lVar26 + 8);
              if (piVar20 != (int *)0x0) {
                LOCK();
                *piVar20 = *piVar20 + -1;
                UNLOCK();
                if (*piVar20 == 0) {
                  plVar5 = *(long **)((long)local_98.data + lVar26 + 0x20);
                  if (plVar5 == (long *)0x0) {
                    if (*(void **)((long)local_98.data + lVar26) != (void *)0x0) {
                      free(*(void **)((long)local_98.data + lVar26));
                    }
                  }
                  else {
                    (**(code **)(*plVar5 + 0x18))();
                  }
                }
              }
              *(undefined8 *)((long)&pMVar1->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar1->elemsize + 4) = 0;
              pMVar1->data = (void *)0x0;
              pMVar1->refcount = (int *)0x0;
              puVar2 = (undefined8 *)((long)pvVar15 + lVar26 + 0x28);
              *puVar2 = 0;
              puVar2[1] = 0;
              *(undefined8 *)((long)pvVar15 + lVar26 + 0x38) = 0;
              *(void **)((long)pvVar15 + lVar26) = local_d8.data;
              piVar20 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
              *(int **)((long)pvVar15 + lVar26 + 8) = piVar20;
              *(ulong *)((long)pvVar15 + lVar26 + 0x10) =
                   CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
              *(int *)((long)pvVar15 + lVar26 + 0x18) = local_d8.elempack;
              *(Allocator **)((long)pvVar15 + lVar26 + 0x20) = local_d8.allocator;
              piVar3 = (int *)((long)pvVar15 + lVar26 + 0x28);
              *piVar3 = local_d8.dims;
              piVar3[1] = local_d8.w;
              piVar3[2] = local_d8.h;
              piVar3[3] = local_d8.c;
              *(size_t *)((long)pvVar15 + lVar26 + 0x38) = local_d8.cstep;
            }
            if (piVar20 != (int *)0x0) {
              LOCK();
              *piVar20 = *piVar20 + -1;
              UNLOCK();
              if (*piVar20 == 0) {
                if (local_d8.allocator == (Allocator *)0x0) {
                  if (local_d8.data != (void *)0x0) {
                    free(local_d8.data);
                  }
                }
                else {
                  (**(code **)(*(long *)local_d8.allocator + 0x18))();
                }
              }
            }
          }
        }
        if (opt->use_bf16_storage == true) {
          __arg = *(Option **)((long)local_98.data + lVar26 + 0x10);
          uVar24 = (ulong)*(int *)((long)local_98.data + lVar26 + 0x18);
          if (((ulong)__arg / uVar24 == 4) && (pLVar23->support_bf16_storage == true)) {
            local_d8.elemsize._0_4_ = 0;
            local_d8.elemsize._4_4_ = 0;
            local_d8.elempack = 0;
            local_d8.data = (void *)0x0;
            local_d8.refcount._0_4_ = 0;
            local_d8.refcount._4_4_ = 0;
            local_d8.h = 0;
            local_d8.c = 0;
            local_d8.cstep = 0;
            local_d8.allocator = (Allocator *)0x0;
            local_d8.dims = 0;
            local_d8.w = 0;
            cast_float32_to_bfloat16((Mat *)((long)local_98.data + lVar26),&local_d8,opt);
            pvVar15 = local_98.data;
            pMVar1 = (Mat *)((long)local_98.data + lVar26);
            piVar20 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
            if (pMVar1 != &local_d8) {
              if (piVar20 != (int *)0x0) {
                LOCK();
                *piVar20 = *piVar20 + 1;
                UNLOCK();
              }
              piVar20 = *(int **)((long)local_98.data + lVar26 + 8);
              if (piVar20 != (int *)0x0) {
                LOCK();
                *piVar20 = *piVar20 + -1;
                UNLOCK();
                if (*piVar20 == 0) {
                  plVar5 = *(long **)((long)local_98.data + lVar26 + 0x20);
                  if (plVar5 == (long *)0x0) {
                    if (*(void **)((long)local_98.data + lVar26) != (void *)0x0) {
                      free(*(void **)((long)local_98.data + lVar26));
                    }
                  }
                  else {
                    (**(code **)(*plVar5 + 0x18))();
                  }
                }
              }
              *(undefined8 *)((long)&pMVar1->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar1->elemsize + 4) = 0;
              pMVar1->data = (void *)0x0;
              pMVar1->refcount = (int *)0x0;
              puVar2 = (undefined8 *)((long)pvVar15 + lVar26 + 0x28);
              *puVar2 = 0;
              puVar2[1] = 0;
              *(undefined8 *)((long)pvVar15 + lVar26 + 0x38) = 0;
              *(void **)((long)pvVar15 + lVar26) = local_d8.data;
              piVar20 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
              *(int **)((long)pvVar15 + lVar26 + 8) = piVar20;
              *(ulong *)((long)pvVar15 + lVar26 + 0x10) =
                   CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
              *(int *)((long)pvVar15 + lVar26 + 0x18) = local_d8.elempack;
              *(Allocator **)((long)pvVar15 + lVar26 + 0x20) = local_d8.allocator;
              piVar3 = (int *)((long)pvVar15 + lVar26 + 0x28);
              *piVar3 = local_d8.dims;
              piVar3[1] = local_d8.w;
              piVar3[2] = local_d8.h;
              piVar3[3] = local_d8.c;
              *(size_t *)((long)pvVar15 + lVar26 + 0x38) = local_d8.cstep;
            }
            if (piVar20 != (int *)0x0) {
              LOCK();
              *piVar20 = *piVar20 + -1;
              UNLOCK();
              if (*piVar20 == 0) {
                if (local_d8.allocator == (Allocator *)0x0) {
                  if (local_d8.data != (void *)0x0) {
                    free(local_d8.data);
                  }
                }
                else {
                  (**(code **)(*(long *)local_d8.allocator + 0x18))();
                }
              }
            }
            __arg = *(Option **)((long)local_98.data + lVar26 + 0x10);
            uVar24 = (ulong)*(int *)((long)local_98.data + lVar26 + 0x18);
          }
          if (((ulong)__arg / uVar24 == 2) && (pLVar23->support_bf16_storage == false)) {
            local_d8.elemsize._0_4_ = 0;
            local_d8.elemsize._4_4_ = 0;
            local_d8.elempack = 0;
            local_d8.data = (void *)0x0;
            local_d8.refcount._0_4_ = 0;
            local_d8.refcount._4_4_ = 0;
            local_d8.h = 0;
            local_d8.c = 0;
            local_d8.cstep = 0;
            local_d8.allocator = (Allocator *)0x0;
            local_d8.dims = 0;
            local_d8.w = 0;
            cast_bfloat16_to_float32((Mat *)((long)local_98.data + lVar26),&local_d8,opt);
            pvVar15 = local_98.data;
            pMVar1 = (Mat *)((long)local_98.data + lVar26);
            piVar20 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
            if (pMVar1 != &local_d8) {
              if (piVar20 != (int *)0x0) {
                LOCK();
                *piVar20 = *piVar20 + 1;
                UNLOCK();
              }
              piVar20 = *(int **)((long)local_98.data + lVar26 + 8);
              if (piVar20 != (int *)0x0) {
                LOCK();
                *piVar20 = *piVar20 + -1;
                UNLOCK();
                if (*piVar20 == 0) {
                  plVar5 = *(long **)((long)local_98.data + lVar26 + 0x20);
                  if (plVar5 == (long *)0x0) {
                    if (*(void **)((long)local_98.data + lVar26) != (void *)0x0) {
                      free(*(void **)((long)local_98.data + lVar26));
                    }
                  }
                  else {
                    (**(code **)(*plVar5 + 0x18))();
                  }
                }
              }
              *(undefined8 *)((long)&pMVar1->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar1->elemsize + 4) = 0;
              pMVar1->data = (void *)0x0;
              pMVar1->refcount = (int *)0x0;
              puVar2 = (undefined8 *)((long)pvVar15 + lVar26 + 0x28);
              *puVar2 = 0;
              puVar2[1] = 0;
              *(undefined8 *)((long)pvVar15 + lVar26 + 0x38) = 0;
              *(void **)((long)pvVar15 + lVar26) = local_d8.data;
              piVar20 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
              *(int **)((long)pvVar15 + lVar26 + 8) = piVar20;
              *(ulong *)((long)pvVar15 + lVar26 + 0x10) =
                   CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
              *(int *)((long)pvVar15 + lVar26 + 0x18) = local_d8.elempack;
              *(Allocator **)((long)pvVar15 + lVar26 + 0x20) = local_d8.allocator;
              piVar3 = (int *)((long)pvVar15 + lVar26 + 0x28);
              *piVar3 = local_d8.dims;
              piVar3[1] = local_d8.w;
              piVar3[2] = local_d8.h;
              piVar3[3] = local_d8.c;
              *(size_t *)((long)pvVar15 + lVar26 + 0x38) = local_d8.cstep;
            }
            if (piVar20 != (int *)0x0) {
              LOCK();
              *piVar20 = *piVar20 + -1;
              UNLOCK();
              if (*piVar20 == 0) {
                if (local_d8.allocator == (Allocator *)0x0) {
                  if (local_d8.data != (void *)0x0) {
                    free(local_d8.data);
                  }
                }
                else {
                  (**(code **)(*(long *)local_d8.allocator + 0x18))();
                }
              }
            }
          }
        }
        if (opt->use_packing_layout == true) {
          local_d8.elemsize._0_4_ = 0;
          local_d8.elemsize._4_4_ = 0;
          local_d8.elempack = 0;
          local_d8.data = (void *)0x0;
          local_d8.refcount._0_4_ = 0;
          local_d8.refcount._4_4_ = 0;
          local_d8.h = 0;
          local_d8.c = 0;
          local_d8.cstep = 0;
          local_d8.allocator = (Allocator *)0x0;
          local_d8.dims = 0;
          local_d8.w = 0;
          convert_packing((Mat *)((long)local_98.data + lVar26),&local_d8,
                          (uint)pLVar23->support_packing + (uint)pLVar23->support_packing * 2 + 1,
                          opt);
          pvVar15 = local_98.data;
          pMVar1 = (Mat *)((long)local_98.data + lVar26);
          piVar20 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
          if (pMVar1 != &local_d8) {
            if (piVar20 != (int *)0x0) {
              LOCK();
              *piVar20 = *piVar20 + 1;
              UNLOCK();
            }
            piVar20 = *(int **)((long)local_98.data + lVar26 + 8);
            if (piVar20 != (int *)0x0) {
              LOCK();
              *piVar20 = *piVar20 + -1;
              UNLOCK();
              if (*piVar20 == 0) {
                plVar5 = *(long **)((long)local_98.data + lVar26 + 0x20);
                if (plVar5 == (long *)0x0) {
                  if (*(void **)((long)local_98.data + lVar26) != (void *)0x0) {
                    free(*(void **)((long)local_98.data + lVar26));
                  }
                }
                else {
                  (**(code **)(*plVar5 + 0x18))();
                }
              }
            }
            *(undefined8 *)((long)&pMVar1->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar1->elemsize + 4) = 0;
            pMVar1->data = (void *)0x0;
            pMVar1->refcount = (int *)0x0;
            puVar2 = (undefined8 *)((long)pvVar15 + lVar26 + 0x28);
            *puVar2 = 0;
            puVar2[1] = 0;
            *(undefined8 *)((long)pvVar15 + lVar26 + 0x38) = 0;
            *(void **)((long)pvVar15 + lVar26) = local_d8.data;
            piVar20 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
            *(int **)((long)pvVar15 + lVar26 + 8) = piVar20;
            *(ulong *)((long)pvVar15 + lVar26 + 0x10) =
                 CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
            *(int *)((long)pvVar15 + lVar26 + 0x18) = local_d8.elempack;
            *(Allocator **)((long)pvVar15 + lVar26 + 0x20) = local_d8.allocator;
            piVar3 = (int *)((long)pvVar15 + lVar26 + 0x28);
            *piVar3 = local_d8.dims;
            piVar3[1] = local_d8.w;
            piVar3[2] = local_d8.h;
            piVar3[3] = local_d8.c;
            *(size_t *)((long)pvVar15 + lVar26 + 0x38) = local_d8.cstep;
          }
          if (piVar20 != (int *)0x0) {
            LOCK();
            *piVar20 = *piVar20 + -1;
            UNLOCK();
            if (*piVar20 == 0) {
              if (local_d8.allocator == (Allocator *)0x0) {
                if (local_d8.data != (void *)0x0) {
                  free(local_d8.data);
                }
              }
              else {
                (**(code **)(*(long *)local_d8.allocator + 0x18))();
              }
            }
          }
        }
        uVar25 = uVar25 + 1;
        piVar21 = (pLVar23->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar26 = lVar26 + 0x40;
      } while (uVar25 < (ulong)((long)(pLVar23->bottoms).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)piVar21 >> 2));
    }
    if ((opt->lightmode == true) && (pLVar23->support_inplace == true)) {
      iVar16 = (*pLVar23->_vptr_Layer[8])(pLVar23,&local_98,opt);
      pLVar23 = local_48;
      if (iVar16 != 0) {
LAB_0012e528:
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_98);
        return iVar16;
      }
      piVar21 = (local_48->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar22 = (local_48->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (piVar22 != piVar21) {
        lVar26 = 0;
        uVar25 = 0;
        do {
          pvVar15 = local_98.data;
          pMVar19 = (local_40->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start + piVar21[uVar25];
          if ((pointer)((long)local_98.data + lVar26) != pMVar19) {
            piVar20 = *(int **)((long)local_98.data + lVar26 + 8);
            if (piVar20 != (int *)0x0) {
              LOCK();
              *piVar20 = *piVar20 + 1;
              UNLOCK();
            }
            piVar20 = pMVar19->refcount;
            if (piVar20 != (int *)0x0) {
              LOCK();
              *piVar20 = *piVar20 + -1;
              UNLOCK();
              if (*piVar20 == 0) {
                if (pMVar19->allocator == (Allocator *)0x0) {
                  if (pMVar19->data != (void *)0x0) {
                    free(pMVar19->data);
                  }
                }
                else {
                  (**(code **)(*(long *)pMVar19->allocator + 0x18))();
                }
              }
            }
            *(undefined8 *)((long)&pMVar19->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar19->elemsize + 4) = 0;
            pMVar19->data = (void *)0x0;
            pMVar19->refcount = (int *)0x0;
            pMVar19->dims = 0;
            pMVar19->w = 0;
            pMVar19->h = 0;
            pMVar19->c = 0;
            pMVar19->cstep = 0;
            piVar20 = (int *)((undefined8 *)((long)pvVar15 + lVar26))[1];
            pMVar19->data = *(void **)((long)pvVar15 + lVar26);
            pMVar19->refcount = piVar20;
            pMVar19->elemsize = *(size_t *)((long)pvVar15 + lVar26 + 0x10);
            pMVar19->elempack = *(int *)((long)pvVar15 + lVar26 + 0x18);
            pMVar19->allocator = *(Allocator **)((long)pvVar15 + lVar26 + 0x20);
            puVar2 = (undefined8 *)((long)pvVar15 + lVar26 + 0x28);
            uVar7 = *puVar2;
            uVar8 = puVar2[1];
            pMVar19->dims = (int)uVar7;
            pMVar19->w = (int)((ulong)uVar7 >> 0x20);
            pMVar19->h = (int)uVar8;
            pMVar19->c = (int)((ulong)uVar8 >> 0x20);
            pMVar19->cstep = *(size_t *)((long)pvVar15 + lVar26 + 0x38);
            piVar21 = (pLVar23->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar22 = (pLVar23->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          uVar25 = uVar25 + 1;
          lVar26 = lVar26 + 0x40;
        } while (uVar25 < (ulong)((long)piVar22 - (long)piVar21 >> 2));
      }
    }
    else {
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_d8,
                 (long)(pLVar23->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 *(long *)&(pLVar23->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data >> 2,&local_49);
      iVar16 = (*pLVar23->_vptr_Layer[6])(pLVar23,&local_98,&local_d8,opt);
      pLVar23 = local_48;
      if (iVar16 != 0) {
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_d8);
        goto LAB_0012e528;
      }
      piVar21 = (local_48->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar22 = (local_48->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (piVar22 != piVar21) {
        lVar26 = 0;
        uVar25 = 0;
        do {
          pvVar15 = local_d8.data;
          pMVar19 = (local_40->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start + piVar21[uVar25];
          if ((pointer)((long)local_d8.data + lVar26) != pMVar19) {
            piVar20 = *(int **)((long)local_d8.data + lVar26 + 8);
            if (piVar20 != (int *)0x0) {
              LOCK();
              *piVar20 = *piVar20 + 1;
              UNLOCK();
            }
            piVar20 = pMVar19->refcount;
            if (piVar20 != (int *)0x0) {
              LOCK();
              *piVar20 = *piVar20 + -1;
              UNLOCK();
              if (*piVar20 == 0) {
                if (pMVar19->allocator == (Allocator *)0x0) {
                  if (pMVar19->data != (void *)0x0) {
                    free(pMVar19->data);
                  }
                }
                else {
                  (**(code **)(*(long *)pMVar19->allocator + 0x18))();
                }
              }
            }
            *(undefined8 *)((long)&pMVar19->refcount + 4) = 0;
            *(undefined8 *)((long)&pMVar19->elemsize + 4) = 0;
            pMVar19->data = (void *)0x0;
            pMVar19->refcount = (int *)0x0;
            pMVar19->dims = 0;
            pMVar19->w = 0;
            pMVar19->h = 0;
            pMVar19->c = 0;
            pMVar19->cstep = 0;
            piVar20 = (int *)((undefined8 *)((long)pvVar15 + lVar26))[1];
            pMVar19->data = *(void **)((long)pvVar15 + lVar26);
            pMVar19->refcount = piVar20;
            pMVar19->elemsize = *(size_t *)((long)pvVar15 + lVar26 + 0x10);
            pMVar19->elempack = *(int *)((long)pvVar15 + lVar26 + 0x18);
            pMVar19->allocator = *(Allocator **)((long)pvVar15 + lVar26 + 0x20);
            puVar2 = (undefined8 *)((long)pvVar15 + lVar26 + 0x28);
            uVar7 = *puVar2;
            uVar8 = puVar2[1];
            pMVar19->dims = (int)uVar7;
            pMVar19->w = (int)((ulong)uVar7 >> 0x20);
            pMVar19->h = (int)uVar8;
            pMVar19->c = (int)((ulong)uVar8 >> 0x20);
            pMVar19->cstep = *(size_t *)((long)pvVar15 + lVar26 + 0x38);
            piVar21 = (pLVar23->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar22 = (pLVar23->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          uVar25 = uVar25 + 1;
          lVar26 = lVar26 + 0x40;
        } while (uVar25 < (ulong)((long)piVar22 - (long)piVar21 >> 2));
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_d8);
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_98);
  }
  return 0;
}

Assistant:

int Net::forward_layer(int layer_index, std::vector<Mat>& blob_mats, const Option& opt) const
{
    const Layer* layer = layers[layer_index];

//     NCNN_LOGE("forward_layer %d %s", layer_index, layer->name.c_str());

    if (layer->one_blob_only)
    {
        // load bottom blob
        int bottom_blob_index = layer->bottoms[0];
        int top_blob_index = layer->tops[0];

        if (blob_mats[bottom_blob_index].dims == 0)
        {
            int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
            if (ret != 0)
                return ret;
        }

        Mat bottom_blob = blob_mats[bottom_blob_index];

        if (opt.lightmode)
        {
            // delete after taken in light mode
            blob_mats[bottom_blob_index].release();
            // deep copy for inplace forward if data is shared
            if (layer->support_inplace && *bottom_blob.refcount != 1)
            {
                bottom_blob = bottom_blob.clone();
            }
        }

        if (opt.use_bf16_storage)
        {
            if (bottom_blob.elemsize / bottom_blob.elempack == 4u && layer->support_bf16_storage)
            {
                Mat bottom_blob_bf16;
                cast_float32_to_bfloat16(bottom_blob, bottom_blob_bf16, opt);
                bottom_blob = bottom_blob_bf16;
            }
            if (bottom_blob.elemsize / bottom_blob.elempack == 2u && !layer->support_bf16_storage)
            {
                Mat bottom_blob_fp32;
                cast_bfloat16_to_float32(bottom_blob, bottom_blob_fp32, opt);
                bottom_blob = bottom_blob_fp32;
            }
        }

        if (opt.use_packing_layout)
        {
            int elempack = layer->support_packing ? 4 : 1;

            Mat bottom_blob_packed;
            convert_packing(bottom_blob, bottom_blob_packed, elempack, opt);
            bottom_blob = bottom_blob_packed;
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            Mat& bottom_top_blob = bottom_blob;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward_inplace(bottom_top_blob, opt);
            double end = get_current_time();
            benchmark(layer, bottom_top_blob, bottom_top_blob, start, end);
#else
            int ret = layer->forward_inplace(bottom_top_blob, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = bottom_top_blob;
        }
        else
        {
            Mat top_blob;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward(bottom_blob, top_blob, opt);
            double end = get_current_time();
            benchmark(layer, bottom_blob, top_blob, start, end);
#else
            int ret = layer->forward(bottom_blob, top_blob, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = top_blob;
        }

    }
    else
    {
        // load bottom blobs
        std::vector<Mat> bottom_blobs(layer->bottoms.size());
        for (size_t i=0; i<layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            if (blob_mats[bottom_blob_index].dims == 0)
            {
                int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
                if (ret != 0)
                    return ret;
            }

            bottom_blobs[i] = blob_mats[bottom_blob_index];

            if (opt.lightmode)
            {
                // delete after taken in light mode
                blob_mats[bottom_blob_index].release();
                // deep copy for inplace forward if data is shared
                if (layer->support_inplace && *bottom_blobs[i].refcount != 1)
                {
                    bottom_blobs[i] = bottom_blobs[i].clone();
                }
            }

            if (opt.use_bf16_storage)
            {
                if (bottom_blobs[i].elemsize / bottom_blobs[i].elempack == 4u && layer->support_bf16_storage)
                {
                    Mat bottom_blob_bf16;
                    cast_float32_to_bfloat16(bottom_blobs[i], bottom_blob_bf16, opt);
                    bottom_blobs[i] = bottom_blob_bf16;
                }
                if (bottom_blobs[i].elemsize / bottom_blobs[i].elempack == 2u && !layer->support_bf16_storage)
                {
                    Mat bottom_blob_fp32;
                    cast_bfloat16_to_float32(bottom_blobs[i], bottom_blob_fp32, opt);
                    bottom_blobs[i] = bottom_blob_fp32;
                }
            }

            if (opt.use_packing_layout)
            {
                int elempack = layer->support_packing ? 4 : 1;

                Mat bottom_blob_packed;
                convert_packing(bottom_blobs[i], bottom_blob_packed, elempack, opt);
                bottom_blobs[i] = bottom_blob_packed;
            }
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            std::vector<Mat>& bottom_top_blobs = bottom_blobs;
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
            double end = get_current_time();
            benchmark(layer, start, end);
#else
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i=0; i<layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = bottom_top_blobs[i];
            }
        }
        else
        {
            std::vector<Mat> top_blobs(layer->tops.size());
#if NCNN_BENCHMARK
            double start = get_current_time();
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
            double end = get_current_time();
            benchmark(layer, start, end);
#else
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
#endif // NCNN_BENCHMARK
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i=0; i<layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = top_blobs[i];
            }
        }
    }

//     NCNN_LOGE("forward_layer %d %s done", layer_index, layer->name.c_str());
//     const Mat& blob = blob_mats[layer->tops[0]];
//     NCNN_LOGE("[%-2d %-16s %-16s]  %d    blobs count = %-3d   size = %-3d x %-3d", layer_index, layer->type.c_str(), layer->name.c_str(), layer->tops[0], blob.c, blob.h, blob.w);

    return 0;
}